

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O1

int Fra_OneHotRefineUsingCex(Fra_Man_t *p,Vec_Int_t *vOneHots)

{
  uint uVar1;
  uint uVar2;
  Aig_Man_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  int *piVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  
  pAVar3 = p->pManAig;
  if (p->pSml->pAig != pAVar3) {
    __assert_fail("p->pSml->pAig == p->pManAig",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraHot.c"
                  ,0x10f,"int Fra_OneHotRefineUsingCex(Fra_Man_t *, Vec_Int_t *)");
  }
  iVar8 = vOneHots->nSize;
  if (iVar8 < 1) {
    iVar9 = 0;
  }
  else {
    iVar12 = pAVar3->nObjs[2] - pAVar3->nRegs;
    lVar11 = 0;
    iVar9 = 0;
    do {
      if ((long)iVar8 <= lVar11 + 1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar1 = vOneHots->pArray[lVar11];
      uVar2 = vOneHots->pArray[lVar11 + 1];
      if (uVar1 != 0 || uVar2 != 0) {
        uVar7 = ~uVar1;
        if (0 < (int)uVar1) {
          uVar7 = uVar1 - 1;
        }
        uVar7 = uVar7 + iVar12;
        if ((int)uVar7 < 0) {
LAB_00903b8a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pVVar4 = p->pManAig->vCis;
        iVar8 = pVVar4->nSize;
        if (iVar8 <= (int)uVar7) goto LAB_00903b8a;
        uVar10 = ~uVar2;
        if (0 < (int)uVar2) {
          uVar10 = uVar2 - 1;
        }
        uVar10 = uVar10 + iVar12;
        if (((int)uVar10 < 0) || (iVar8 <= (int)uVar10)) goto LAB_00903b8a;
        ppvVar5 = pVVar4->pArray;
        iVar8 = Fra_OneHotNodesAreClause
                          (p->pSml,(Aig_Obj_t *)ppvVar5[uVar7],(Aig_Obj_t *)ppvVar5[uVar10],
                           uVar1 >> 0x1f,uVar2 >> 0x1f);
        if (iVar8 == 0) {
          if (vOneHots->nSize <= lVar11) {
LAB_00903bc8:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          piVar6 = vOneHots->pArray;
          piVar6[lVar11] = 0;
          if ((long)vOneHots->nSize <= lVar11 + 1) goto LAB_00903bc8;
          piVar6[lVar11 + 1] = 0;
          iVar9 = 1;
        }
      }
      lVar11 = lVar11 + 2;
      iVar8 = vOneHots->nSize;
    } while ((int)lVar11 < iVar8);
  }
  return iVar9;
}

Assistant:

int Fra_OneHotRefineUsingCex( Fra_Man_t * p, Vec_Int_t * vOneHots )
{
    Aig_Obj_t * pObj1, * pObj2;
    int i, Out1, Out2, RetValue = 0;
    int nPiNum = Aig_ManCiNum(p->pManAig) - Aig_ManRegNum(p->pManAig);
    assert( p->pSml->pAig == p->pManAig );
    for ( i = 0; i < Vec_IntSize(vOneHots); i += 2 )
    {
        Out1 = Vec_IntEntry( vOneHots, i );
        Out2 = Vec_IntEntry( vOneHots, i+1 );
        if ( Out1 == 0 && Out2 == 0 )
            continue;
        // get the corresponding nodes
        pObj1 = Aig_ManCi( p->pManAig, nPiNum + Fra_LitReg(Out1) );
        pObj2 = Aig_ManCi( p->pManAig, nPiNum + Fra_LitReg(Out2) );
        // check if implication holds using this simulation info
        if ( !Fra_OneHotNodesAreClause( p->pSml, pObj1, pObj2, Fra_LitSign(Out1), Fra_LitSign(Out2) ) )
        {
            Vec_IntWriteEntry( vOneHots, i, 0 );
            Vec_IntWriteEntry( vOneHots, i+1, 0 );
            RetValue = 1;
        }
    }
    return RetValue;
}